

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::setTarget(XFormWidget *this,Selection *_target)

{
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *this_00;
  double dVar1;
  SceneObject *pSVar2;
  HalfedgeElement *pHVar3;
  pointer pVVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  SceneObject *pSVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Joint *this_01;
  long lVar13;
  Mesh *pMVar14;
  double *pdVar15;
  BBox *pBVar16;
  byte bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined8 uStack_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  double dStack_68;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  bVar17 = 0;
  pSVar2 = (this->target).object;
  pSVar10 = _target->object;
  pHVar3 = _target->element;
  dVar1 = (_target->coordinates).y;
  uVar11 = *(undefined8 *)((long)&(_target->coordinates).y + 4);
  uVar12 = *(undefined8 *)((long)&(_target->coordinates).z + 4);
  (this->target).coordinates.x = (_target->coordinates).x;
  (this->target).coordinates.y = dVar1;
  *(undefined8 *)((long)&(this->target).coordinates.y + 4) = uVar11;
  *(undefined8 *)((long)&(this->target).coordinates.z + 4) = uVar12;
  (this->target).object = pSVar10;
  (this->target).element = pHVar3;
  if (this->objectMode == true) {
    if ((XFormWidget *)(this->target).object == this) {
      (this->target).object = pSVar2;
    }
    (this->target).element = (HalfedgeElement *)0x0;
    updateGeometry(this);
    return;
  }
  if ((this->target).object == (SceneObject *)0x0) {
    return;
  }
  this_00 = &this->axes;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(this_00,3);
  if (this->objectMode != true) {
    pHVar3 = (this->target).element;
    if (pHVar3 == (HalfedgeElement *)0x0) {
      return;
    }
    if (this->transformedMode == true) {
      (**pHVar3->_vptr_HalfedgeElement)(&uStack_78);
      pSVar2 = (this->target).object;
      dVar1 = (pSVar2->position).z;
      dVar6 = (pSVar2->position).x + (double)CONCAT44(uStack_78._4_4_,(undefined4)uStack_78);
      dVar20 = (pSVar2->position).y + (double)CONCAT44(uStack_6c,uStack_70);
      auVar5._8_4_ = SUB84(dVar20,0);
      auVar5._0_8_ = dVar6;
      auVar5._12_4_ = (int)((ulong)dVar20 >> 0x20);
      (this->center).x = dVar6;
      (this->center).y = (double)auVar5._8_8_;
      (this->center).z = dStack_68 + dVar1;
    }
    else {
      (**pHVar3->_vptr_HalfedgeElement)(&uStack_78);
      (this->center).z = dStack_68;
      *(undefined4 *)&(this->center).x = (undefined4)uStack_78;
      *(undefined4 *)((long)&(this->center).x + 4) = uStack_78._4_4_;
      *(undefined4 *)&(this->center).y = uStack_70;
      *(undefined4 *)((long)&(this->center).y + 4) = uStack_6c;
    }
    (*((this->target).element)->_vptr_HalfedgeElement[1])(&uStack_78);
    pdVar15 = (double *)&uStack_78;
    pBVar16 = &this->bounds;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      (pBVar16->max).x = *pdVar15;
      pdVar15 = pdVar15 + (ulong)bVar17 * -2 + 1;
      pBVar16 = (BBox *)((long)pBVar16 + (ulong)bVar17 * -0x10 + 8);
    }
    pHVar3 = (this->target).element;
    (*pHVar3->_vptr_HalfedgeElement[2])(pHVar3,this_00);
    return;
  }
  pSVar2 = (this->target).object;
  if (pSVar2 == (SceneObject *)0x0) {
    this_01 = (Joint *)0x0;
  }
  else {
    this_01 = (Joint *)__dynamic_cast(pSVar2,&SceneObject::typeinfo,&Joint::typeinfo,0);
  }
  if (this_01 == (Joint *)0x0) {
    (this->center).z = (pSVar2->position).z;
    uVar7 = *(undefined4 *)((long)&(pSVar2->position).x + 4);
    uVar8 = *(undefined4 *)&(pSVar2->position).y;
    uVar9 = *(undefined4 *)((long)&(pSVar2->position).y + 4);
    *(undefined4 *)&(this->center).x = *(undefined4 *)&(pSVar2->position).x;
    *(undefined4 *)((long)&(this->center).x + 4) = uVar7;
    *(undefined4 *)&(this->center).y = uVar8;
    *(undefined4 *)((long)&(this->center).y + 4) = uVar9;
  }
  else {
    if (this->poseMode == true) {
      Joint::getBasePosInWorld(this_01);
    }
    else {
      Joint::getEndPosInWorld(this_01);
    }
    (this->center).z = dStack_68;
    *(undefined4 *)&(this->center).x = (undefined4)uStack_78;
    *(undefined4 *)((long)&(this->center).x + 4) = uStack_78._4_4_;
    *(undefined4 *)&(this->center).y = uStack_70;
    *(undefined4 *)((long)&(this->center).y + 4) = uStack_6c;
  }
  if ((this->poseMode == true && this_01 != (Joint *)0x0) && (this_01 == this_01->skeleton->root)) {
    pMVar14 = this_01->skeleton->mesh;
  }
  else {
    if (this_01 != (Joint *)0x0 && this->poseMode == false) {
      dVar1 = (this_01->super_SceneObject).position.z;
      dVar20 = (this_01->super_SceneObject).position.x;
      dVar21 = (this_01->super_SceneObject).position.y;
      (*(this_01->skeleton->mesh->super_SceneObject)._vptr_SceneObject[4])(&uStack_78);
      dVar6 = dVar1 - dStack_38 * 0.15000000596046448;
      dVar18 = dVar20 + dStack_48 * 0.15000000596046448;
      dVar19 = dVar21 + dStack_40 * 0.15000000596046448;
      dVar1 = dStack_38 * 0.15000000596046448 + dVar1;
      (this->bounds).max.x = dVar18;
      (this->bounds).max.y = dVar19;
      (this->bounds).max.z = dVar1;
      dVar20 = dVar20 - dStack_48 * 0.15000000596046448;
      dVar21 = dVar21 - dStack_40 * 0.15000000596046448;
      (this->bounds).min.x = dVar20;
      (this->bounds).min.y = dVar21;
      (this->bounds).min.z = dVar6;
      (this->bounds).extent.x = dVar18 - dVar20;
      (this->bounds).extent.y = dVar19 - dVar21;
      (this->bounds).extent.z = dVar1 - dVar6;
      goto LAB_00175058;
    }
    pMVar14 = (Mesh *)(this->target).object;
  }
  (*(pMVar14->super_SceneObject)._vptr_SceneObject[4])(&uStack_78);
  pdVar15 = (double *)&uStack_78;
  pBVar16 = &this->bounds;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pBVar16->max).x = *pdVar15;
    pdVar15 = pdVar15 + (ulong)bVar17 * -2 + 1;
    pBVar16 = (BBox *)((long)pBVar16 + (ulong)bVar17 * -0x10 + 8);
  }
LAB_00175058:
  if (((this_01 == (Joint *)0x0) || (this->poseMode == false)) ||
     (this_01 == this_01->skeleton->root)) {
    pVVar4 = (this_00->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4->x = 1.0;
    pVVar4->y = 0.0;
    pVVar4->z = 0.0;
    pVVar4[1].x = 0.0;
    pVVar4[1].y = 1.0;
    pVVar4[1].z = 0.0;
    pVVar4[2].x = 0.0;
    pVVar4[2].y = 0.0;
    pVVar4[2].z = 1.0;
  }
  else {
    Joint::getAxes(this_01,this_00);
  }
  return;
}

Assistant:

void XFormWidget::setTarget(Selection& _target) {
  auto originalObj = target.object;
  target = _target;
  if (objectMode) {
    if (target.object == this) target.object = originalObj;
    target.element = nullptr;
  }

  updateGeometry();
}